

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgkcl(char *tcard)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  char card [20];
  
  card[0] = '\0';
  strncat(card,tcard,8);
  sVar4 = strlen(card);
  builtin_strncpy(card + sVar4,"        ",9);
  ffupch(card);
  __s1 = card + 1;
  switch(card[0]) {
  case 'B':
    if ((card._1_4_ & 0xff) == 0x5a) {
      pcVar5 = "ZERO   ";
LAB_00142b52:
      iVar2 = bcmp(__s1,pcVar5,7);
      if (iVar2 == 0) {
        return 0x1e;
      }
      return 0x96;
    }
    if ((card._1_4_ & 0xff) == 0x4c) {
      iVar2 = bcmp(__s1,"LOCKED ",7);
      if (iVar2 == 0) {
        return 10;
      }
      iVar2 = bcmp(__s1,"LANK   ",7);
      if (iVar2 != 0) {
        return 0x96;
      }
      return 0x28;
    }
    uVar1 = card._1_4_ & 0xff;
    if (uVar1 == 0x53) {
      pcVar5 = "SCALE  ";
      goto LAB_00142b52;
    }
    if (uVar1 == 0x55) {
      iVar2 = bcmp(__s1,"UNIT   ",7);
      if (iVar2 != 0) {
        return 0x96;
      }
      return 0x46;
    }
    if (uVar1 != 0x49) {
      return 0x96;
    }
    pcVar5 = "ITPIX  ";
    break;
  case 'C':
    switch(card._1_4_ & 0xff) {
    case 0x48:
      iVar2 = bcmp(__s1,"HECKSUM",7);
      if (iVar2 != 0) {
        return 0x96;
      }
      return 100;
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
      goto LAB_001430ab;
    case 0x4f:
      iVar2 = bcmp(__s1,"OMMENT",6);
      if (iVar2 != 0) {
        iVar2 = bcmp(__s1,"ONTINUE",7);
        if (iVar2 != 0) {
          return 0x96;
        }
        return 0x8c;
      }
      if (*tcard == 'C') {
        iVar2 = strncmp(tcard,"COMMENT   and Astrophysics\', volume 376, page 3",0x2f);
        if (iVar2 == 0) {
          return 10;
        }
        iVar2 = strncmp(tcard,"COMMENT   FITS (Flexible Image Transport System",0x2f);
        if (iVar2 == 0) {
          return 10;
        }
        iVar2 = strncmp(tcard,"COMMENT   Astrophysics Supplement Series v44/p3",0x2f);
        if (iVar2 == 0) {
          return 10;
        }
        iVar2 = strncmp(tcard,"COMMENT   Contact the NASA Science Office of St",0x2f);
        if (iVar2 == 0) {
          return 10;
        }
        iVar2 = strncmp(tcard,"COMMENT   FITS Definition document #100 and oth",0x2f);
        if (iVar2 == 0) {
          return 10;
        }
      }
      goto LAB_00142a13;
    case 0x52:
      if ((((card._1_4_ != 0x4c415652) && (card._1_4_ != 0x58495052)) && (card._1_4_ != 0x41544f52))
         && (card._1_4_ != 0x52454452)) {
        return 0x96;
      }
      break;
    case 0x53:
      if (card._1_4_ != 0x52455953) {
        return 0x96;
      }
      break;
    case 0x54:
      if (card._1_4_ != 0x45505954) {
        return 0x96;
      }
      break;
    case 0x55:
      if (card._1_4_ != 0x54494e55) {
        return 0x96;
      }
      break;
    default:
      if (card[1] != 'D') {
        return 0x96;
      }
      if (card._1_4_ == 0x544c4544) break;
      goto switchD_00142900_caseD_50;
    }
    goto LAB_00142f75;
  case 'D':
    if (card[1] != 'A') {
      return 0x96;
    }
    iVar2 = bcmp(__s1,"ATASUM ",7);
    if (iVar2 == 0) {
      return 100;
    }
    iVar2 = bcmp(__s1,"ATAMIN ",7);
    if (iVar2 == 0) {
      return 0x3c;
    }
    iVar2 = bcmp(__s1,"ATAMAX ",7);
    if (iVar2 == 0) {
      return 0x3c;
    }
    pcVar5 = "ATE-OBS";
LAB_00142a5e:
    iVar2 = bcmp(__s1,pcVar5,7);
    if (iVar2 != 0) {
      return 0x96;
    }
    return 0x78;
  case 'E':
    if ((card._1_4_ & 0xff) != 0x4e) {
      if ((card._1_4_ & 0xff) == 0x50) {
        pcVar5 = "POCH   ";
        goto LAB_00142a5e;
      }
      if ((card._1_4_ & 0xff) != 0x51) {
        if ((card._1_4_ & 0xff) != 0x58) {
          return 0x96;
        }
        iVar2 = bcmp(__s1,"XTEND  ",7);
        if (iVar2 == 0) {
          return 10;
        }
        iVar2 = bcmp(__s1,"XTNAME ",7);
        if (iVar2 != 0) {
          iVar2 = bcmp(__s1,"XTVER  ",7);
          iVar3 = 0x5a;
          if (iVar2 == 0) {
            return 0x5a;
          }
          pcVar5 = "XTLEVEL";
          goto LAB_00142d3b;
        }
        if (*tcard != 'E') {
          return 0x5a;
        }
        iVar2 = strncmp(tcard,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c);
        bVar6 = iVar2 == 0;
        iVar3 = 0x14;
        iVar2 = 0x5a;
        goto LAB_00142a22;
      }
      iVar3 = bcmp(__s1,"QUINOX",6);
      iVar2 = 0x78;
      if (iVar3 == 0) {
        return 0x78;
      }
      pcVar5 = "QUI";
      goto LAB_00142a9c;
    }
    pcVar5 = "ND     ";
    break;
  case 'F':
  case 'I':
  case 'J':
  case 'K':
  case 'O':
  case 'Q':
  case 'U':
  case 'V':
  case 'Y':
    goto switchD_0014246e_caseD_46;
  case 'G':
    if ((card._1_4_ & 0xff) == 0x52) {
      pcVar5 = "ROUPS  ";
    }
    else {
      if ((card._1_4_ & 0xff) != 0x43) {
        return 0x96;
      }
      pcVar5 = "COUNT  ";
    }
    break;
  case 'H':
    if ((card._1_4_ & 0xff) != 0x49) {
      if ((card._1_4_ & 0xff) != 0x44) {
        return 0x96;
      }
      iVar2 = bcmp(__s1,"DUNAME ",7);
      iVar3 = 0x5a;
      if (iVar2 == 0) {
        return 0x5a;
      }
      iVar2 = bcmp(__s1,"DUVER  ",7);
      if (iVar2 == 0) {
        return 0x5a;
      }
      pcVar5 = "DULEVEL";
      goto LAB_00142d3b;
    }
    iVar2 = bcmp(__s1,"ISTORY",6);
    if (iVar2 != 0) {
      return 0x96;
    }
LAB_00142a13:
    bVar6 = card[7] == ' ';
    iVar3 = 0x82;
    iVar2 = 0x96;
LAB_00142a22:
    if (bVar6) {
      return iVar3;
    }
    return iVar2;
  case 'L':
    if ((card._1_4_ & 0xff) == 0x41) {
      iVar3 = bcmp(__s1,"ATPOLE",6);
      iVar2 = 0x6e;
      if (iVar3 == 0) {
        return 0x6e;
      }
      pcVar5 = "ATP";
    }
    else {
      if ((card._1_4_ & 0xff) != 0x4f) {
        return 0x96;
      }
      iVar3 = bcmp(__s1,"ONPOLE",6);
      iVar2 = 0x6e;
      if (iVar3 == 0) {
        return 0x6e;
      }
      pcVar5 = "ONP";
    }
    goto LAB_00142a9c;
  case 'M':
    if (card[1] != 'J') {
      return 0x96;
    }
    iVar3 = bcmp(__s1,"JD-OBS ",7);
    iVar2 = 0x78;
    if (iVar3 == 0) {
      return 0x78;
    }
    if (card._1_4_ != 0x424f444a) {
      return 0x96;
    }
    goto LAB_00142ab3;
  case 'N':
    if (card[1] != 'A') {
      return 0x96;
    }
    if (card._1_4_ == 0x53495841) {
      if (card[5] == ' ' || (byte)(card[5] - 0x30U) < 10) {
        return 10;
      }
      return 0x96;
    }
    return 0x96;
  case 'P':
    if (((card._1_4_ & 0xff) != 0x56) && ((card._1_4_ & 0xff) != 0x53)) {
      if (card[1] != 'C') {
        return 0x96;
      }
      iVar2 = bcmp(__s1,"COUNT  ",7);
      if (iVar2 == 0) {
        return 10;
      }
    }
    goto switchD_00142900_caseD_50;
  case 'R':
    if (card[1] != 'A') {
      return 0x96;
    }
    iVar3 = bcmp(__s1,"ADECSYS",7);
    iVar2 = 0x78;
    if (iVar3 == 0) {
      return 0x78;
    }
    iVar3 = bcmp(__s1,"ADESYS",6);
    if (iVar3 == 0) {
      return 0x78;
    }
    pcVar5 = "ADE";
    goto LAB_00142a9c;
  case 'S':
    if (card[1] != 'I') {
      return 0x96;
    }
    pcVar5 = "IMPLE  ";
    break;
  case 'T':
    switch(card._1_4_ & 0xff) {
    case 0x42:
      if (card._1_4_ != 0x4c4f4342) {
        return 0x96;
      }
      goto LAB_00142e09;
    case 0x43:
      if (card._1_4_ == 0x50595443) goto LAB_00142f75;
      iVar2 = bcmp(__s1,"CTY",3);
      if (iVar2 != 0) {
        if (card._1_4_ == 0x494e5543) goto LAB_00142f75;
        iVar2 = bcmp(__s1,"CUN",3);
        if (iVar2 != 0) {
          if (card._1_4_ == 0x4c565243) goto LAB_00142f75;
          iVar2 = bcmp(__s1,"CRV",3);
          if (iVar2 != 0) {
            if (card._1_4_ == 0x58505243) goto LAB_00142f75;
            iVar2 = bcmp(__s1,"CRP",3);
            if (iVar2 != 0) {
              if ((card._1_4_ == 0x544f5243) || (card._1_4_ == 0x544c4443)) goto LAB_00142f75;
              iVar2 = bcmp(__s1,"CDE",3);
              if ((iVar2 != 0) &&
                 ((iVar2 = bcmp(__s1,"CRD",3), iVar2 != 0 &&
                  (iVar2 = bcmp(__s1,"CSY",3), iVar2 != 0)))) goto switchD_00142900_caseD_50;
            }
          }
        }
      }
      goto LAB_00142f19;
    case 0x44:
      iVar2 = bcmp(__s1,"DIM",3);
      if (iVar2 == 0) {
        if (9 < (byte)(card[4] - 0x30U)) {
          return 0x96;
        }
        return 0x32;
      }
      if (card._1_4_ == 0x50534944) {
        if (9 < (byte)(card[5] - 0x30U)) {
          return 0x96;
        }
        return 0x50;
      }
      if ((card._1_4_ != 0x4e494d44) && (card._1_4_ != 0x58414d44)) {
        return 0x96;
      }
      goto LAB_00142f57;
    default:
      return 0x96;
    case 0x46:
      if (card._1_4_ == 0x4d524f46) goto LAB_00142e09;
      pcVar5 = "FIELDS ";
      break;
    case 0x48:
      pcVar5 = "HEAP   ";
      break;
    case 0x4c:
      if ((card._1_4_ != 0x4e494d4c) && (card._1_4_ != 0x58414d4c)) {
        return 0x96;
      }
LAB_00142f57:
      if (9 < (byte)(card[5] - 0x30U)) {
        return 0x96;
      }
      return 0x3c;
    case 0x4e:
      if (card._1_4_ != 0x4c4c554e) {
        return 0x96;
      }
      if (9 < (byte)(card[5] - 0x30U)) {
        return 0x96;
      }
      return 0x28;
    case 0x50:
    case 0x56:
      goto switchD_00142900_caseD_50;
    case 0x53:
      if (card._1_4_ == 0x4c414353) goto LAB_00142fb8;
      goto switchD_00142900_caseD_50;
    case 0x54:
      if (card._1_4_ != 0x45505954) {
        return 0x96;
      }
LAB_00142e09:
      if ((byte)(card[5] - 0x30U) < 10) {
        return 10;
      }
      return 0x96;
    case 0x55:
      if (card._1_4_ != 0x54494e55) {
        return 0x96;
      }
      if (9 < (byte)(card[5] - 0x30U)) {
        return 0x96;
      }
      return 0x46;
    case 0x57:
      pcVar5 = "WCS";
      goto LAB_00142ddd;
    case 0x5a:
      if (card._1_4_ != 0x4f52455a) {
        return 0x96;
      }
LAB_00142fb8:
      if (9 < (byte)(card[5] - 0x30U)) {
        return 0x96;
      }
      return 0x1e;
    }
    break;
  case 'W':
    if (card[1] != 'C') {
      return 0x96;
    }
    iVar3 = bcmp(__s1,"CSAXES",6);
    iVar2 = 0x6e;
    if (iVar3 == 0) {
      return 0x6e;
    }
    iVar3 = bcmp(__s1,"CSNAME",6);
    if (iVar3 == 0) {
      return 0x6e;
    }
    iVar3 = bcmp(__s1,"CAX",3);
    card[5] = card[4];
    if (iVar3 == 0) goto LAB_00142ab3;
    pcVar5 = "CSN";
LAB_00142a9c:
    iVar3 = bcmp(__s1,pcVar5,3);
    card[5] = card[4];
    if (iVar3 != 0) {
      return 0x96;
    }
LAB_00142ab3:
    if (9 < (byte)(card[5] - 0x30U)) {
      return 0x96;
    }
    return iVar2;
  case 'X':
    if (card[1] != 'T') {
      return 0x96;
    }
    pcVar5 = "TENSION";
    break;
  case 'Z':
    card[4] = card[5];
    switch(card._1_4_ & 0xff) {
    case 0x42:
      iVar2 = bcmp(__s1,"BITPIX ",7);
      iVar3 = 0x14;
      if (iVar2 == 0) {
        return 0x14;
      }
      iVar2 = bcmp(__s1,"BLANK  ",7);
      if (iVar2 == 0) {
        return 0x14;
      }
      pcVar5 = "BLOCKED";
      goto LAB_00142d3b;
    case 0x43:
      pcVar5 = "CMPTYPE";
      break;
    case 0x44:
      pcVar5 = "DITHER0";
      break;
    case 0x45:
      pcVar5 = "EXTEND ";
      break;
    default:
      return 0x96;
    case 0x47:
      pcVar5 = "GCOUNT ";
      break;
    case 0x49:
      pcVar5 = "IMAGE  ";
      break;
    case 0x4e:
      bVar6 = card._1_4_ != 0x454d414e;
      if (bVar6) {
        iVar2 = bcmp(__s1,"NAXIS",5);
        if (iVar2 != 0) {
          return 0x96;
        }
        if (card[6] == ' ' || (byte)(card[6] - 0x30U) < 10) {
          return 0x14;
        }
        return 0x96;
      }
      goto LAB_00142fa9;
    case 0x50:
      pcVar5 = "PCOUNT ";
      break;
    case 0x51:
      pcVar5 = "QUANTIZ";
      break;
    case 0x53:
      iVar2 = bcmp(__s1,"SCALE  ",7);
      iVar3 = 0x14;
      if (iVar2 == 0) {
        return 0x14;
      }
      pcVar5 = "SIMPLE ";
LAB_00142d3b:
      iVar2 = bcmp(__s1,pcVar5,7);
      if (iVar2 != 0) {
        return 0x96;
      }
      return iVar3;
    case 0x54:
      bVar6 = card._1_4_ == 0x454c4954;
      if (bVar6) goto LAB_00142fa9;
      pcVar5 = "TENSION";
      break;
    case 0x56:
      iVar2 = bcmp(__s1,"VAL",3);
      if (iVar2 != 0) {
        return 0x96;
      }
LAB_00142fa9:
      if ((byte)(card[4] - 0x30U) < 10) {
        return 0x14;
      }
      return 0x96;
    case 0x5a:
      pcVar5 = "ZERO   ";
    }
    iVar2 = bcmp(__s1,pcVar5,7);
    if (iVar2 != 0) {
      return 0x96;
    }
    return 0x14;
  default:
    if (card[0] == ' ') {
      return 0x82;
    }
switchD_0014246e_caseD_46:
    if (9 < (byte)(card[0] - 0x30U)) {
      return 0x96;
    }
    if (((card._1_4_ & 0xff) == 0x56) || ((card._1_4_ & 0xff) == 0x53)) {
switchD_00142900_caseD_50:
      card[5] = card[2];
    }
    else {
      if (card[1] == 'C') {
        if (card._1_4_ == 0x50595443) goto LAB_00142f75;
        iVar2 = bcmp(__s1,"CTY",3);
        if (iVar2 != 0) {
          if (card._1_4_ == 0x494e5543) goto LAB_00142f75;
          iVar2 = bcmp(__s1,"CUN",3);
          if (iVar2 != 0) {
            if (card._1_4_ == 0x4c565243) goto LAB_00142f75;
            iVar2 = bcmp(__s1,"CRV",3);
            if (iVar2 != 0) {
              if (card._1_4_ == 0x58505243) goto LAB_00142f75;
              iVar2 = bcmp(__s1,"CRP",3);
              if (iVar2 != 0) {
                if ((card._1_4_ == 0x544f5243) || (card._1_4_ == 0x544c4443)) goto LAB_00142f75;
                iVar2 = bcmp(__s1,"CDE",3);
                if ((iVar2 != 0) && (iVar2 = bcmp(__s1,"CRD",3), iVar2 != 0)) {
                  pcVar5 = "CSY";
LAB_00142ddd:
                  iVar2 = bcmp(__s1,pcVar5,3);
                  if (iVar2 != 0) {
                    return 0x96;
                  }
                }
              }
            }
          }
        }
      }
      else {
        if (9 < (byte)(card[1] - 0x30U)) {
          return 0x96;
        }
        if ((card[3] != 'C' || card[2] != 'P') && (card[3] != 'D' || card[2] != 'C')) {
          return 0x96;
        }
      }
LAB_00142f19:
      card[5] = card[4];
    }
LAB_00142f75:
    if (9 < (byte)(card[5] - 0x30U)) {
      return 0x96;
    }
    return 0x6e;
  }
  iVar2 = bcmp(__s1,pcVar5,7);
  if (iVar2 == 0) {
    return 10;
  }
LAB_001430ab:
  return 0x96;
}

Assistant:

int ffgkcl(char *tcard)

/*
   Return the type classification of the input header record

   TYP_STRUC_KEY: SIMPLE, BITPIX, NAXIS, NAXISn, EXTEND, BLOCKED,
                  GROUPS, PCOUNT, GCOUNT, END
                  XTENSION, TFIELDS, TTYPEn, TBCOLn, TFORMn, THEAP,
                   and the first 4 COMMENT keywords in the primary array
                   that define the FITS format.

   TYP_CMPRS_KEY:
            The keywords used in the compressed image format
                  ZIMAGE, ZCMPTYPE, ZNAMEn, ZVALn, ZTILEn, 
                  ZBITPIX, ZNAXISn, ZSCALE, ZZERO, ZBLANK,
                  EXTNAME = 'COMPRESSED_IMAGE'
		  ZSIMPLE, ZTENSION, ZEXTEND, ZBLOCKED, ZPCOUNT, ZGCOUNT
		  ZQUANTIZ, ZDITHER0

   TYP_SCAL_KEY:  BSCALE, BZERO, TSCALn, TZEROn

   TYP_NULL_KEY:  BLANK, TNULLn

   TYP_DIM_KEY:   TDIMn

   TYP_RANG_KEY:  TLMINn, TLMAXn, TDMINn, TDMAXn, DATAMIN, DATAMAX

   TYP_UNIT_KEY:  BUNIT, TUNITn

   TYP_DISP_KEY:  TDISPn

   TYP_HDUID_KEY: EXTNAME, EXTVER, EXTLEVEL, HDUNAME, HDUVER, HDULEVEL

   TYP_CKSUM_KEY  CHECKSUM, DATASUM

   TYP_WCS_KEY:
           Primary array:
                  WCAXES, CTYPEn, CUNITn, CRVALn, CRPIXn, CROTAn, CDELTn
                  CDj_is, PVj_ms, LONPOLEs, LATPOLEs
  
           Pixel list:
                  TCTYPn, TCTYns, TCUNIn, TCUNns, TCRVLn, TCRVns, TCRPXn, TCRPks,
                  TCDn_k, TCn_ks, TPVn_m, TPn_ms, TCDLTn, TCROTn

           Bintable vector:
                  jCTYPn, jCTYns, jCUNIn, jCUNns, jCRVLn, jCRVns, iCRPXn, iCRPns,
                  jiCDn, jiCDns, jPVn_m, jPn_ms, jCDLTn, jCROTn
                
   TYP_REFSYS_KEY:
                   EQUINOXs, EPOCH, MJD-OBSs, RADECSYS, RADESYSs

   TYP_COMM_KEY:  COMMENT, HISTORY, (blank keyword)

   TYP_CONT_KEY:  CONTINUE

   TYP_USER_KEY:  all other keywords

*/ 
{
    char card[20], *card1, *card5;

    card[0] = '\0';
    strncat(card, tcard, 8);   /* copy the keyword name */
    strcat(card, "        "); /* append blanks to make at least 8 chars long */
    ffupch(card);  /* make sure it is in upper case */

    card1 = card + 1;  /* pointer to 2nd character */
    card5 = card + 5;  /* pointer to 6th character */

    /* the strncmp function is slow, so try to be more efficient */
    if (*card == 'Z')
    {
	if (FSTRNCMP (card1, "IMAGE  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "CMPTYPE", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "NAME", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "VAL", 3) == 0)
        {
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "TILE", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "BITPIX ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "NAXIS", 5) == 0)
        {
            if ( ( *(card + 6) >= '0' && *(card + 6) <= '9' )
             || (*(card + 6) == ' ') )
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "SCALE  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "ZERO   ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "BLANK  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "SIMPLE ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "TENSION", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "EXTEND ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "BLOCKED", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "PCOUNT ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "GCOUNT ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "QUANTIZ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "DITHER0", 7) == 0)
	    return (TYP_CMPRS_KEY);
    }
    else if (*card == ' ')
    {
	return (TYP_COMM_KEY);
    }
    else if (*card == 'B')
    {
	if (FSTRNCMP (card1, "ITPIX  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "LOCKED ", 7) == 0)
	    return (TYP_STRUC_KEY);

	if (FSTRNCMP (card1, "LANK   ", 7) == 0)
	    return (TYP_NULL_KEY);

	if (FSTRNCMP (card1, "SCALE  ", 7) == 0)
	    return (TYP_SCAL_KEY);
	if (FSTRNCMP (card1, "ZERO   ", 7) == 0)
	    return (TYP_SCAL_KEY);

	if (FSTRNCMP (card1, "UNIT   ", 7) == 0)
	    return (TYP_UNIT_KEY);
    }
    else if (*card == 'C')
    {
	if (FSTRNCMP (card1, "OMMENT",6) == 0)
	{
          /* new comment string starting Oct 2001 */
	    if (FSTRNCMP (tcard, "COMMENT   and Astrophysics', volume 376, page 3",
              47) == 0)
	        return (TYP_STRUC_KEY);

         /* original COMMENT strings from 1993 - 2001 */
	    if (FSTRNCMP (tcard, "COMMENT   FITS (Flexible Image Transport System",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   Astrophysics Supplement Series v44/p3",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   Contact the NASA Science Office of St",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   FITS Definition document #100 and oth",
              47) == 0)
	        return (TYP_STRUC_KEY);

            if (*(card + 7) == ' ')
	        return (TYP_COMM_KEY);
            else
                return (TYP_USER_KEY);
	}

	if (FSTRNCMP (card1, "HECKSUM", 7) == 0)
	    return (TYP_CKSUM_KEY);

	if (FSTRNCMP (card1, "ONTINUE", 7) == 0)
	    return (TYP_CONT_KEY);

	if (FSTRNCMP (card1, "TYPE",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "UNIT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RVAL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RPIX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "ROTA",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RDER",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "SYER",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "DELT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'D')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'D')
    {
	if (FSTRNCMP (card1, "ATASUM ", 7) == 0)
	    return (TYP_CKSUM_KEY);
	if (FSTRNCMP (card1, "ATAMIN ", 7) == 0)
	    return (TYP_RANG_KEY);
	if (FSTRNCMP (card1, "ATAMAX ", 7) == 0)
	    return (TYP_RANG_KEY);
	if (FSTRNCMP (card1, "ATE-OBS", 7) == 0)
	    return (TYP_REFSYS_KEY);    }
    else if (*card == 'E')
    {
	if (FSTRNCMP (card1, "XTEND  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "ND     ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "XTNAME ", 7) == 0)
	{
            /* check for special compressed image value */
            if (FSTRNCMP(tcard, "EXTNAME = 'COMPRESSED_IMAGE'", 28) == 0)
	      return (TYP_CMPRS_KEY);
            else
	      return (TYP_HDUID_KEY);
	}
	if (FSTRNCMP (card1, "XTVER  ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "XTLEVEL", 7) == 0)
	    return (TYP_HDUID_KEY);

	if (FSTRNCMP (card1, "QUINOX", 6) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "QUI",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_REFSYS_KEY);
        }
	if (FSTRNCMP (card1, "POCH   ", 7) == 0)
	    return (TYP_REFSYS_KEY);
    }
    else if (*card == 'G')
    {
	if (FSTRNCMP (card1, "COUNT  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "ROUPS  ", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'H')
    {
	if (FSTRNCMP (card1, "DUNAME ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "DUVER  ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "DULEVEL", 7) == 0)
	    return (TYP_HDUID_KEY);

	if (FSTRNCMP (card1, "ISTORY",6) == 0)
        {
            if (*(card + 7) == ' ')
	        return (TYP_COMM_KEY);
            else
                return (TYP_USER_KEY);
        }
    }
    else if (*card == 'L')
    {
	if (FSTRNCMP (card1, "ONPOLE",6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "ATPOLE",6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "ONP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "ATP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'M')
    {
	if (FSTRNCMP (card1, "JD-OBS ", 7) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "JDOB",4) == 0)
        {
            if (*(card+5) >= '0' && *(card+5) <= '9')
	        return (TYP_REFSYS_KEY);
        }
    }
    else if (*card == 'N')
    {
	if (FSTRNCMP (card1, "AXIS", 4) == 0)
        {
            if ((*card5 >= '0' && *card5 <= '9')
             || (*card5 == ' '))
	        return (TYP_STRUC_KEY);
        }
    }
    else if (*card == 'P')
    {
	if (FSTRNCMP (card1, "COUNT  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (*card1 == 'C')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'V')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'S')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'R')
    {
	if (FSTRNCMP (card1, "ADECSYS", 7) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "ADESYS", 6) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "ADE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_REFSYS_KEY);
        }
    }
    else if (*card == 'S')
    {
	if (FSTRNCMP (card1, "IMPLE  ", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'T')
    {
	if (FSTRNCMP (card1, "TYPE", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "FORM", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "BCOL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "FIELDS ", 7) == 0)
	    return (TYP_STRUC_KEY);
	else if (FSTRNCMP (card1, "HEAP   ", 7) == 0)
	    return (TYP_STRUC_KEY);

	else if (FSTRNCMP (card1, "NULL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_NULL_KEY);
        }

	else if (FSTRNCMP (card1, "DIM", 3) == 0)
        {
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
 	        return (TYP_DIM_KEY);
        }

	else if (FSTRNCMP (card1, "UNIT", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_UNIT_KEY);
        }

	else if (FSTRNCMP (card1, "DISP", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_DISP_KEY);
        }

	else if (FSTRNCMP (card1, "SCAL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_SCAL_KEY);
        }
	else if (FSTRNCMP (card1, "ZERO", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_SCAL_KEY);
        }

	else if (FSTRNCMP (card1, "LMIN", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "LMAX", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "DMIN", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "DMAX", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }

	else if (FSTRNCMP (card1, "CTYP",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CTY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUNI",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUN",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRVL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRV",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRPX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CROT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDLT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRD",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "WCS",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "C",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "P",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "V",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "S",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'X')
    {
	if (FSTRNCMP (card1, "TENSION", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'W')
    {
	if (FSTRNCMP (card1, "CSAXES", 6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "CSNAME", 6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "CAX", 3) == 0)
	{
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSN", 3) == 0)
	{
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    
    else if (*card >= '0' && *card <= '9')
    {
      if (*card1 == 'C')
      {
        if (FSTRNCMP (card1, "CTYP",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CTY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUNI",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUN",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRVL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRV",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRPX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CROT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDLT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRD",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
      }
      else if (FSTRNCMP (card1, "V",1) == 0)
      {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
      }
      else if (FSTRNCMP (card1, "S",1) == 0)
      {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
      }
      else if (*card1 >= '0' && *card1 <= '9')
      {   /* 2 digits at beginning of keyword */
	
	    if ( (*(card + 2) == 'P') && (*(card + 3) == 'C') )
	    {
               if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);  /*  ijPCn keyword */
            }
	    else if ( (*(card + 2) == 'C') && (*(card + 3) == 'D') )
	    {
               if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);  /*  ijCDn keyword */
            }
      }
      
    }
    
    return (TYP_USER_KEY);  /* by default all others are user keywords */
}